

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult *
iutest::internal::CmpHelperFloatingPointEQ<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  floating_point<double> *in_RCX;
  floating_point<double> f2;
  floating_point<double> f1;
  FInt local_b0;
  FInt local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_b0 = (FInt)val2;
  local_a8 = (FInt)val1;
  bVar1 = floating_point<double>::AlmostEquals
                    ((floating_point<double> *)&local_a8,(_Myt *)&local_b0);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    FormatForComparisonFailureMessage<iutest::floating_point<double>,iutest::floating_point<double>>
              (&local_40,(internal *)&local_a8,(floating_point<double> *)&local_b0,in_RCX);
    detail::ShowStringQuoted(&local_60,&local_40);
    FormatForComparisonFailureMessage<iutest::floating_point<double>,iutest::floating_point<double>>
              (&local_a0,(internal *)&local_b0,(floating_point<double> *)&local_a8,in_RCX);
    detail::ShowStringQuoted(&local_80,&local_a0);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_60,&local_80,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointEQ(const char* expr1, const char* expr2
                                                , RawType val1, RawType val2)
{
    floating_point<RawType> f1(val1), f2(val2);
    if IUTEST_COND_LIKELY( f1.AlmostEquals(f2) )
    {
        return AssertionSuccess();
    }